

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O0

bool ON_ClampKnotVector(int order,int cv_count,double *knot,int end)

{
  int iVar1;
  int knot_count;
  int i0;
  int i;
  bool rc;
  int end_local;
  double *knot_local;
  int cv_count_local;
  int order_local;
  
  i0._3_1_ = false;
  if (((knot != (double *)0x0) && (1 < order)) && (order <= cv_count)) {
    if ((end == 0) || (end == 2)) {
      for (knot_count = 0; knot_count < order + -2; knot_count = knot_count + 1) {
        knot[knot_count] = knot[order + -2];
      }
      i0._3_1_ = true;
    }
    if ((end == 1) || (end == 2)) {
      iVar1 = ON_KnotCount(order,cv_count);
      for (knot_count = cv_count; knot_count < iVar1; knot_count = knot_count + 1) {
        knot[knot_count] = knot[cv_count + -1];
      }
      i0._3_1_ = true;
    }
  }
  return i0._3_1_;
}

Assistant:

bool ON_ClampKnotVector(
          int order,          // order (>=2)
          int cv_count,       // cv count
          double* knot,       // knot[] array
          int end             // 0 = clamp start, 1 = clamp end, 2 = clamp both ends
          )
{
  // sets initial/final order-2 knot values to match knot[order-2]/knot[cv_count-1]
  bool rc = false;
  int i, i0;
  if ( knot && order >= 2 && cv_count >= order ) {
    if ( end == 0 || end == 2 ) {
      i0 = order-2;
      for ( i = 0; i < i0; i++ ) {
        knot[i] = knot[i0];
      }
      rc = true;
    }
    if ( end == 1 || end == 2 ) {
      const int knot_count = ON_KnotCount(order,cv_count);
      i0 = cv_count-1;
      for ( i = i0+1; i < knot_count; i++ ) {
        knot[i] = knot[i0];
      }
      rc = true;
    }
  }
  return rc;
}